

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int nodeWrite(Rtree *pRtree,RtreeNode *pNode)

{
  Vdbe *p_00;
  sqlite3_mutex *psVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vdbe *p;
  
  if (pNode->isDirty != 0) {
    p_00 = (Vdbe *)pRtree->pWriteNode;
    if (pNode->iNode == 0) {
      iVar3 = vdbeUnbind(p_00,1);
      if ((iVar3 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar1);
      }
    }
    else {
      sqlite3_bind_int64((sqlite3_stmt *)p_00,1,pNode->iNode);
    }
    bindText((sqlite3_stmt *)p_00,2,pNode->zData,pRtree->iNodeSize,(_func_void_void_ptr *)0x0,'\0');
    sqlite3_step((sqlite3_stmt *)p_00);
    pNode->isDirty = 0;
    iVar3 = sqlite3_reset((sqlite3_stmt *)p_00);
    iVar4 = vdbeUnbind(p_00,2);
    if ((iVar4 == 0) && (psVar1 = p_00->db->mutex, psVar1 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    }
    if (iVar3 != 0 || pNode->iNode != 0) {
      return iVar3;
    }
    uVar2 = pRtree->db->lastRowid;
    pNode->iNode = uVar2;
    iVar3 = (int)((uVar2 & 0xffffffff) * 0x51d07eaf >> 0x20);
    uVar5 = (int)uVar2 + (((uint)((int)uVar2 - iVar3) >> 1) + iVar3 >> 6) * -0x61;
    pNode->pNext = pRtree->aHash[uVar5];
    pRtree->aHash[uVar5] = pNode;
  }
  return 0;
}

Assistant:

static int nodeWrite(Rtree *pRtree, RtreeNode *pNode){
  int rc = SQLITE_OK;
  if( pNode->isDirty ){
    sqlite3_stmt *p = pRtree->pWriteNode;
    if( pNode->iNode ){
      sqlite3_bind_int64(p, 1, pNode->iNode);
    }else{
      sqlite3_bind_null(p, 1);
    }
    sqlite3_bind_blob(p, 2, pNode->zData, pRtree->iNodeSize, SQLITE_STATIC);
    sqlite3_step(p);
    pNode->isDirty = 0;
    rc = sqlite3_reset(p);
    sqlite3_bind_null(p, 2);
    if( pNode->iNode==0 && rc==SQLITE_OK ){
      pNode->iNode = sqlite3_last_insert_rowid(pRtree->db);
      nodeHashInsert(pRtree, pNode);
    }
  }
  return rc;
}